

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall
helics::apps::Tracer::Tracer(Tracer *this,string_view appName,CoreApp *core,FederateInfo *fedInfo)

{
  CoreApp *in_RDI;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff60;
  Tracer *this_00;
  FederateInfo *in_stack_ffffffffffffffa0;
  App *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  
  App::App(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffa0);
  (in_RDI->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__Tracer_00a47548;
  *(undefined1 *)&in_RDI[3].name._M_dataplus._M_p = 0;
  *(undefined1 *)((long)&in_RDI[3].name._M_dataplus._M_p + 1) = 0;
  *(undefined1 *)((long)&in_RDI[3].name._M_dataplus._M_p + 2) = 0;
  std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>::
  unique_ptr<std::default_delete<helics::CloningFilter>,void>(in_stack_ffffffffffffff60);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::deque
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x411bf7);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x411c0f);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x411c25);
  this_00 = (Tracer *)(in_RDI + 8);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x411c3d);
  std::unique_ptr<helics::Endpoint,std::default_delete<helics::Endpoint>>::
  unique_ptr<std::default_delete<helics::Endpoint>,void>
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x411c69);
  CLI::std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
              *)this_00);
  CLI::std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
              *)this_00);
  CLI::std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)this_00);
  initialSetup(this_00);
  return;
}

Assistant:

Tracer::Tracer(std::string_view appName, CoreApp& core, const FederateInfo& fedInfo):
    App(appName, core, fedInfo)
{
    initialSetup();
}